

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Theme.cpp
# Opt level: O3

shared_ptr<gui::Style> __thiscall gui::Theme::getStyle(Theme *this,String *widgetName)

{
  anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
  *this_00;
  vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_> *pvVar1;
  Gui *pGVar2;
  iterator iVar3;
  mapped_type *pmVar4;
  runtime_error *this_01;
  long *plVar5;
  long *plVar6;
  key_type *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  shared_ptr<gui::Style> sVar8;
  locale local_90 [8];
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  this_00 = &(widgetName->m_string).field_2;
  iVar3 = std::
          _Rb_tree<sf::String,_std::pair<const_sf::String,_std::shared_ptr<gui::Style>_>,_std::_Select1st<std::pair<const_sf::String,_std::shared_ptr<gui::Style>_>_>,_std::less<sf::String>,_std::allocator<std::pair<const_sf::String,_std::shared_ptr<gui::Style>_>_>_>
          ::find((_Rb_tree<sf::String,_std::pair<const_sf::String,_std::shared_ptr<gui::Style>_>,_std::_Select1st<std::pair<const_sf::String,_std::shared_ptr<gui::Style>_>_>,_std::less<sf::String>,_std::allocator<std::pair<const_sf::String,_std::shared_ptr<gui::Style>_>_>_>
                  *)this_00,in_RDX);
  if (iVar3._M_node == (_Base_ptr)((long)&(widgetName->m_string).field_2 + 8)) {
    (**(code **)((widgetName->m_string)._M_dataplus._M_p + 4))(this,widgetName);
    if (this->_vptr_Theme == (_func_int **)0x0) {
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::locale::locale(local_90);
      sf::String::toAnsiString_abi_cxx11_(&local_68,in_RDX,local_90);
      std::operator+(&local_48,"theme failed to find style for \"",&local_68);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_48);
      local_88 = (long *)*plVar5;
      plVar6 = plVar5 + 2;
      if (local_88 == plVar6) {
        local_78 = *plVar6;
        lStack_70 = plVar5[3];
        local_88 = &local_78;
      }
      else {
        local_78 = *plVar6;
      }
      local_80 = plVar5[1];
      *plVar5 = (long)plVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::runtime_error::runtime_error(this_01,(string *)&local_88);
      __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pmVar4 = std::
             map<sf::String,_std::shared_ptr<gui::Style>,_std::less<sf::String>,_std::allocator<std::pair<const_sf::String,_std::shared_ptr<gui::Style>_>_>_>
             ::operator[]((map<sf::String,_std::shared_ptr<gui::Style>,_std::less<sf::String>,_std::allocator<std::pair<const_sf::String,_std::shared_ptr<gui::Style>_>_>_>
                           *)this_00,in_RDX);
    (pmVar4->super___shared_ptr<gui::Style,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         (element_type *)this->_vptr_Theme;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(pmVar4->super___shared_ptr<gui::Style,_(__gnu_cxx::_Lock_policy)2>)._M_refcount,
               (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->gui_);
    _Var7._M_pi = extraout_RDX_00;
  }
  else {
    this->_vptr_Theme = *(_func_int ***)(iVar3._M_node + 2);
    pGVar2 = (Gui *)iVar3._M_node[2]._M_parent;
    this->gui_ = pGVar2;
    _Var7._M_pi = extraout_RDX;
    if (pGVar2 != (Gui *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        pvVar1 = &(pGVar2->super_ContainerBase).children_;
        *(int *)&(pvVar1->
                 super__Vector_base<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>
                 )._M_impl.super__Vector_impl_data._M_start =
             *(int *)&(pvVar1->
                      super__Vector_base<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + 1;
        UNLOCK();
      }
      else {
        pvVar1 = &(pGVar2->super_ContainerBase).children_;
        *(int *)&(pvVar1->
                 super__Vector_base<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>
                 )._M_impl.super__Vector_impl_data._M_start =
             *(int *)&(pvVar1->
                      super__Vector_base<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + 1;
      }
    }
  }
  sVar8.super___shared_ptr<gui::Style,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var7._M_pi;
  sVar8.super___shared_ptr<gui::Style,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<gui::Style>)sVar8.super___shared_ptr<gui::Style,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Style> Theme::getStyle(const sf::String& widgetName) const {
    auto styleIter = styles_.find(widgetName);
    if (styleIter != styles_.end()) {
        return styleIter->second;
    }

    auto style = loadStyle(widgetName);
    if (style == nullptr) {
        throw std::runtime_error("theme failed to find style for \"" + widgetName.toAnsiString() + "\".");
    }
    styles_[widgetName] = style;
    return style;
}